

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CAssignSubscriptStm *stm)

{
  TypeInfo *left;
  CIdExp *pCVar1;
  _Alloc_hider _Var2;
  IExpression *pIVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TypeInfo *got;
  string errorMessage;
  string variableName;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_90;
  element_type *local_70;
  _Alloc_hider local_68;
  undefined1 local_60 [16];
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CAssignSubscriptStm\n",0x21);
  pCVar1 = (stm->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t
           .super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (((pCVar1 == (CIdExp *)0x0) ||
      ((stm->indexExpression)._M_t.
       super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
       super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) ||
     ((stm->valueExpression)._M_t.
      super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl == (IExpression *)0x0)) {
    CError::CError((CError *)local_c0,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_c0);
    if (local_c0 == (undefined1  [8])local_b0) {
      return;
    }
    goto LAB_00120a2e;
  }
  _Var2._M_p = (pCVar1->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (char *)((long)&local_50 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,_Var2._M_p,_Var2._M_p + (pCVar1->name)._M_string_length);
  local_60._0_8_ =
       (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60._8_8_ =
       (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
    }
  }
  local_70 = (this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_68._M_p =
       (pointer)(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p)->_M_use_count + 1;
    }
  }
  got = (TypeInfo *)&local_70;
  bVar4 = checkVariableVisibility
                    (this,&local_50,(shared_ptr<ClassInfo> *)local_60,(shared_ptr<MethodInfo> *)got)
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if (bVar4) {
    pIVar3 = (stm->indexExpression)._M_t.
             super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
             super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
             super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
    (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
    TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
    left = &this->lastCalculatedType;
    bVar4 = operator==(left,(TypeInfo *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (!bVar4) {
      TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
      bVar4 = operator!=(left,(TypeInfo *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (bVar4) {
        TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
        CError::GetTypeErrorMessage_abi_cxx11_(&local_90,(CError *)local_c0,left,got);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p);
        }
        CError::CError((CError *)local_c0,&local_90,
                       &(((stm->indexExpression)._M_t.
                          super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t
                          .super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                          super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                        super_PositionedNode).position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_c0);
        if (local_c0 != (undefined1  [8])local_b0) {
          operator_delete((void *)local_c0);
        }
        TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
LAB_00120ba6:
        (this->lastCalculatedType).isPrimitive = (bool)local_c0[0];
        *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_c0._1_3_;
        (this->lastCalculatedType).type = local_c0._4_4_;
        std::__cxx11::string::operator=
                  ((string *)&(this->lastCalculatedType).className,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p);
        }
        paVar5 = &local_90.field_2;
        local_b8._M_p = local_90._M_dataplus._M_p;
        goto LAB_00120c69;
      }
      pIVar3 = (stm->valueExpression)._M_t.
               super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
               super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
               super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
      (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
      TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
      bVar4 = operator==(left,(TypeInfo *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (bVar4) goto LAB_00120c73;
      TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
      bVar4 = operator!=(left,(TypeInfo *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (bVar4) {
        TypeInfo::TypeInfo((TypeInfo *)local_c0,INT);
        CError::GetTypeErrorMessage_abi_cxx11_(&local_90,(CError *)local_c0,left,got);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p);
        }
        CError::CError((CError *)local_c0,&local_90,
                       &(((stm->valueExpression)._M_t.
                          super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t
                          .super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                          super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                        super_PositionedNode).position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_c0);
        if (local_c0 != (undefined1  [8])local_b0) {
          operator_delete((void *)local_c0);
        }
        TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
        goto LAB_00120ba6;
      }
      TypeInfo::TypeInfo((TypeInfo *)local_c0,VOID);
      (this->lastCalculatedType).isPrimitive = (bool)local_c0[0];
      *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_c0._1_3_;
      (this->lastCalculatedType).type = local_c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->lastCalculatedType).className,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p == &local_a8) goto LAB_00120c73;
      goto LAB_00120c6e;
    }
  }
  else {
    CError::GetUndeclaredErrorMessage(&local_90,&local_50);
    CError::CError((CError *)local_c0,&local_90,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_c0);
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    TypeInfo::TypeInfo((TypeInfo *)local_c0,ERROR_TYPE);
    (this->lastCalculatedType).isPrimitive = (bool)local_c0[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_c0._1_3_;
    (this->lastCalculatedType).type = local_c0._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_b8);
    paVar5 = &local_a8;
LAB_00120c69:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != paVar5) {
LAB_00120c6e:
      operator_delete(local_b8._M_p);
    }
  }
LAB_00120c73:
  local_c0 = (undefined1  [8])local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p == (char *)((long)&local_50 + 0x10)) {
    return;
  }
LAB_00120a2e:
  operator_delete((void *)local_c0);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CAssignSubscriptStm &stm ) 
{
    std::cout << "typechecker: CAssignSubscriptStm\n";

    if( stm.idExpression && stm.indexExpression && stm.valueExpression ) {
        auto variableName = stm.idExpression->name;
        bool isVisible = checkVariableVisibility( variableName, currentClass, currentMethod );
        if( !isVisible ) {
            errors.push_back( CError( CError::GetUndeclaredErrorMessage( variableName ), stm.position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.indexExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.indexExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.valueExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.valueExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position) );
    }
}